

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  int i_3;
  int iVar6;
  ulong uVar7;
  Allocator *pAVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  void *pvVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  void *pvVar19;
  int q_1;
  uint uVar20;
  int q;
  float fVar21;
  float in_XMM1_Da;
  float local_d4;
  int local_d0;
  int local_c8;
  Mat mins;
  Mat local_78;
  void *local_38;
  
  iVar6 = this->operation;
  switch(iVar6) {
  case 0:
    iVar6 = reduction_op<std::plus<float>,std::plus<float>>
                      (bottom_blob,top_blob,this->coeff,this->dim,in_XMM1_Da,opt);
    return iVar6;
  case 1:
    iVar6 = this->dim;
    local_d4 = this->coeff;
    uVar14 = bottom_blob->w;
    uVar2 = bottom_blob->h;
    uVar17 = bottom_blob->c;
    uVar11 = (ulong)uVar17;
    sVar4 = bottom_blob->elemsize;
    if (iVar6 == 0) {
      pAVar8 = opt->blob_allocator;
      uVar20 = 1;
      goto LAB_0012e550;
    }
    switch(iVar6) {
    default:
      goto switchD_0012e2cf_caseD_0;
    case 1:
      pAVar8 = opt->blob_allocator;
      uVar20 = uVar17;
LAB_0012e550:
      Mat::create(top_blob,uVar20,sVar4,pAVar8);
      goto switchD_0012e2cf_caseD_0;
    case 2:
      pAVar8 = opt->blob_allocator;
      uVar20 = uVar2;
      uVar12 = uVar17;
      break;
    case -2:
      pAVar8 = opt->blob_allocator;
      uVar20 = uVar14;
      uVar12 = uVar2;
      break;
    case -1:
      pAVar8 = opt->blob_allocator;
      uVar20 = uVar14;
      goto LAB_0012e550;
    }
    Mat::create(top_blob,uVar20,uVar12,sVar4,pAVar8);
switchD_0012e2cf_caseD_0:
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar20 = uVar2 * uVar14;
    if (iVar6 == 0) {
      Mat::Mat(&mins,uVar17,sVar4,opt->workspace_allocator);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_0012fecd;
      uVar16 = 0;
      uVar9 = (ulong)uVar20;
      if ((int)uVar20 < 1) {
        uVar9 = uVar16;
      }
      if ((int)uVar17 < 1) {
        uVar11 = uVar16;
      }
      for (; uVar16 != uVar11; uVar16 = uVar16 + 1) {
        Mat::channel(&local_78,bottom_blob,(int)uVar16);
        pvVar15 = local_78.data;
        Mat::~Mat(&local_78);
        fVar21 = 0.0;
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = fVar21 + ABS(*(float *)((long)pvVar15 + uVar7 * 4));
        }
        *(float *)((long)mins.data + uVar16 * 4) = fVar21;
      }
      fVar21 = 0.0;
      for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        fVar21 = fVar21 + *(float *)((long)mins.data + uVar9 * 4);
      }
      goto LAB_0012f569;
    }
    switch(iVar6) {
    case 0:
      goto switchD_0012f3ee_caseD_0;
    case 1:
      uVar9 = (ulong)uVar20;
      if ((int)uVar20 < 1) {
        uVar9 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar11 = 0;
      }
      for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
        Mat::channel(&mins,bottom_blob,(int)uVar16);
        pvVar15 = mins.data;
        Mat::~Mat(&mins);
        fVar21 = 0.0;
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = fVar21 + ABS(*(float *)((long)pvVar15 + uVar7 * 4));
        }
        *(float *)((long)top_blob->data + uVar16 * 4) = fVar21 * local_d4;
      }
      break;
    case 2:
      uVar9 = 0;
      if (0 < (int)uVar14) {
        uVar9 = (ulong)uVar14;
      }
      uVar16 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar16 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar11 = 0;
      }
      for (iVar6 = 0; local_d0 = (int)uVar11, iVar6 != local_d0; iVar6 = iVar6 + 1) {
        Mat::channel(&mins,bottom_blob,iVar6);
        pvVar19 = mins.data;
        Mat::~Mat(&mins);
        iVar3 = top_blob->w;
        sVar4 = top_blob->elemsize;
        pvVar15 = top_blob->data;
        for (uVar7 = 0; uVar7 != uVar16; uVar7 = uVar7 + 1) {
          fVar21 = 0.0;
          for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
            fVar21 = fVar21 + ABS(*(float *)((long)pvVar19 + uVar13 * 4));
          }
          *(float *)((long)pvVar15 + uVar7 * 4 + (long)iVar6 * (long)iVar3 * sVar4) =
               fVar21 * local_d4;
          pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar14 * 4);
        }
      }
      break;
    case -2:
      Mat::fill(top_blob,0.0);
      uVar14 = 0;
      if ((int)uVar20 < 1) {
        uVar20 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar17 = 0;
      }
      for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
        Mat::channel(&mins,bottom_blob,uVar14);
        pvVar19 = mins.data;
        Mat::~Mat(&mins);
        pvVar15 = top_blob->data;
        for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
          *(float *)((long)pvVar15 + uVar11 * 4) =
               ABS(*(float *)((long)pvVar19 + uVar11 * 4)) + *(float *)((long)pvVar15 + uVar11 * 4);
        }
      }
      pvVar15 = top_blob->data;
      for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
        *(float *)((long)pvVar15 + uVar11 * 4) = *(float *)((long)pvVar15 + uVar11 * 4) * local_d4;
      }
      break;
    case -1:
      Mat::Mat(&mins,uVar14,1,uVar17,sVar4,opt->workspace_allocator);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_0012fecd;
      Mat::fill(&mins,0.0);
      uVar9 = 0;
      uVar16 = 0;
      if (0 < (int)uVar14) {
        uVar16 = (ulong)uVar14;
      }
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar9;
      }
      if ((int)uVar17 < 1) {
        uVar11 = uVar9;
      }
      for (; uVar9 != uVar11; uVar9 = uVar9 + 1) {
        Mat::channel(&local_78,bottom_blob,(int)uVar9);
        pvVar15 = local_78.data;
        Mat::~Mat(&local_78);
        sVar5 = mins.cstep;
        sVar4 = mins.elemsize;
        local_38 = mins.data;
        local_78.data = (void *)(mins.cstep * uVar9 * mins.elemsize + (long)mins.data);
        local_78.refcount = (int *)0x0;
        local_78.elemsize = mins.elemsize;
        local_78.packing = mins.packing;
        local_78.allocator = mins.allocator;
        local_78.dims = 2;
        local_78.w = mins.w;
        local_78.h = mins.h;
        local_78.c = 1;
        local_78.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_78);
        lVar18 = sVar5 * sVar4 * uVar9;
        for (uVar13 = 0; uVar13 != uVar7; uVar13 = uVar13 + 1) {
          for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)local_38 + uVar10 * 4 + lVar18) =
                 ABS(*(float *)((long)pvVar15 + uVar13 * 4)) +
                 *(float *)((long)local_38 + uVar10 * 4 + lVar18);
          }
          pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar14 * 4);
        }
      }
      Mat::fill(top_blob,0.0);
      for (uVar9 = 0; sVar5 = mins.cstep, sVar4 = mins.elemsize, pvVar15 = mins.data,
          uVar9 != uVar11; uVar9 = uVar9 + 1) {
        local_78.data = (void *)(mins.cstep * uVar9 * mins.elemsize + (long)mins.data);
        local_78.refcount = (int *)0x0;
        local_78.elemsize = mins.elemsize;
        local_78.packing = mins.packing;
        local_78.allocator = mins.allocator;
        local_78.dims = 2;
        local_78.w = mins.w;
        local_78.h = mins.h;
        local_78.c = 1;
        local_78.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_78);
        pvVar19 = top_blob->data;
        for (uVar7 = 0; uVar16 != uVar7; uVar7 = uVar7 + 1) {
          *(float *)((long)pvVar19 + uVar7 * 4) =
               *(float *)((long)pvVar15 + uVar7 * 4 + sVar5 * sVar4 * uVar9) +
               *(float *)((long)pvVar19 + uVar7 * 4);
        }
      }
      pvVar15 = top_blob->data;
      for (uVar11 = 0; uVar16 != uVar11; uVar11 = uVar11 + 1) {
        *(float *)((long)pvVar15 + uVar11 * 4) = *(float *)((long)pvVar15 + uVar11 * 4) * local_d4;
      }
      goto LAB_0012f57b;
    }
    goto switchD_0012f3ee_default;
  case 2:
    iVar6 = this->dim;
    local_d4 = this->coeff;
    uVar14 = bottom_blob->w;
    uVar2 = bottom_blob->h;
    uVar17 = bottom_blob->c;
    uVar11 = (ulong)uVar17;
    sVar4 = bottom_blob->elemsize;
    if (iVar6 == 0) {
      pAVar8 = opt->blob_allocator;
      uVar20 = 1;
      goto LAB_0012e3aa;
    }
    switch(iVar6) {
    default:
      goto switchD_0012e235_caseD_0;
    case 1:
      pAVar8 = opt->blob_allocator;
      uVar20 = uVar17;
LAB_0012e3aa:
      Mat::create(top_blob,uVar20,sVar4,pAVar8);
      goto switchD_0012e235_caseD_0;
    case 2:
      pAVar8 = opt->blob_allocator;
      uVar20 = uVar2;
      uVar12 = uVar17;
      break;
    case -2:
      pAVar8 = opt->blob_allocator;
      uVar20 = uVar14;
      uVar12 = uVar2;
      break;
    case -1:
      pAVar8 = opt->blob_allocator;
      uVar20 = uVar14;
      goto LAB_0012e3aa;
    }
    Mat::create(top_blob,uVar20,uVar12,sVar4,pAVar8);
switchD_0012e235_caseD_0:
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar20 = uVar2 * uVar14;
    if (iVar6 == 0) {
      Mat::Mat(&mins,uVar17,sVar4,opt->workspace_allocator);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_0012fecd;
      uVar16 = 0;
      uVar9 = (ulong)uVar20;
      if ((int)uVar20 < 1) {
        uVar9 = uVar16;
      }
      if ((int)uVar17 < 1) {
        uVar11 = uVar16;
      }
      for (; uVar16 != uVar11; uVar16 = uVar16 + 1) {
        Mat::channel(&local_78,bottom_blob,(int)uVar16);
        pvVar15 = local_78.data;
        Mat::~Mat(&local_78);
        fVar21 = 0.0;
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          fVar1 = *(float *)((long)pvVar15 + uVar7 * 4);
          fVar21 = fVar21 + fVar1 * fVar1;
        }
        *(float *)((long)mins.data + uVar16 * 4) = fVar21;
      }
      fVar21 = 0.0;
      for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        fVar21 = fVar21 + *(float *)((long)mins.data + uVar9 * 4);
      }
      goto LAB_0012f569;
    }
    switch(iVar6) {
    case 0:
      goto switchD_0012f3ee_caseD_0;
    case 1:
      uVar9 = (ulong)uVar20;
      if ((int)uVar20 < 1) {
        uVar9 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar11 = 0;
      }
      for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
        Mat::channel(&mins,bottom_blob,(int)uVar16);
        pvVar15 = mins.data;
        Mat::~Mat(&mins);
        fVar21 = 0.0;
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          fVar1 = *(float *)((long)pvVar15 + uVar7 * 4);
          fVar21 = fVar21 + fVar1 * fVar1;
        }
        *(float *)((long)top_blob->data + uVar16 * 4) = fVar21 * local_d4;
      }
      break;
    case 2:
      uVar9 = 0;
      if (0 < (int)uVar14) {
        uVar9 = (ulong)uVar14;
      }
      uVar16 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar16 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar11 = 0;
      }
      for (iVar6 = 0; local_d0 = (int)uVar11, iVar6 != local_d0; iVar6 = iVar6 + 1) {
        Mat::channel(&mins,bottom_blob,iVar6);
        pvVar19 = mins.data;
        Mat::~Mat(&mins);
        iVar3 = top_blob->w;
        sVar4 = top_blob->elemsize;
        pvVar15 = top_blob->data;
        for (uVar7 = 0; uVar7 != uVar16; uVar7 = uVar7 + 1) {
          fVar21 = 0.0;
          for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
            fVar1 = *(float *)((long)pvVar19 + uVar13 * 4);
            fVar21 = fVar21 + fVar1 * fVar1;
          }
          *(float *)((long)pvVar15 + uVar7 * 4 + (long)iVar6 * (long)iVar3 * sVar4) =
               fVar21 * local_d4;
          pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar14 * 4);
        }
      }
      break;
    case -2:
      Mat::fill(top_blob,0.0);
      uVar14 = 0;
      if ((int)uVar20 < 1) {
        uVar20 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar17 = 0;
      }
      for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
        Mat::channel(&mins,bottom_blob,uVar14);
        pvVar19 = mins.data;
        Mat::~Mat(&mins);
        pvVar15 = top_blob->data;
        for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
          fVar21 = *(float *)((long)pvVar19 + uVar11 * 4);
          *(float *)((long)pvVar15 + uVar11 * 4) =
               fVar21 * fVar21 + *(float *)((long)pvVar15 + uVar11 * 4);
        }
      }
      pvVar15 = top_blob->data;
      for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
        *(float *)((long)pvVar15 + uVar11 * 4) = *(float *)((long)pvVar15 + uVar11 * 4) * local_d4;
      }
      break;
    case -1:
      Mat::Mat(&mins,uVar14,1,uVar17,sVar4,opt->workspace_allocator);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_0012fecd;
      Mat::fill(&mins,0.0);
      uVar9 = 0;
      uVar16 = 0;
      if (0 < (int)uVar14) {
        uVar16 = (ulong)uVar14;
      }
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar9;
      }
      if ((int)uVar17 < 1) {
        uVar11 = uVar9;
      }
      for (; uVar9 != uVar11; uVar9 = uVar9 + 1) {
        Mat::channel(&local_78,bottom_blob,(int)uVar9);
        pvVar15 = local_78.data;
        Mat::~Mat(&local_78);
        sVar5 = mins.cstep;
        sVar4 = mins.elemsize;
        local_38 = mins.data;
        local_78.data = (void *)(mins.cstep * uVar9 * mins.elemsize + (long)mins.data);
        local_78.refcount = (int *)0x0;
        local_78.elemsize = mins.elemsize;
        local_78.packing = mins.packing;
        local_78.allocator = mins.allocator;
        local_78.dims = 2;
        local_78.w = mins.w;
        local_78.h = mins.h;
        local_78.c = 1;
        local_78.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_78);
        lVar18 = sVar5 * sVar4 * uVar9;
        for (uVar13 = 0; uVar13 != uVar7; uVar13 = uVar13 + 1) {
          for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
            fVar21 = *(float *)((long)pvVar15 + uVar13 * 4);
            *(float *)((long)local_38 + uVar10 * 4 + lVar18) =
                 fVar21 * fVar21 + *(float *)((long)local_38 + uVar10 * 4 + lVar18);
          }
          pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar14 * 4);
        }
      }
      Mat::fill(top_blob,0.0);
      for (uVar9 = 0; sVar5 = mins.cstep, sVar4 = mins.elemsize, pvVar15 = mins.data,
          uVar9 != uVar11; uVar9 = uVar9 + 1) {
        local_78.data = (void *)(mins.cstep * uVar9 * mins.elemsize + (long)mins.data);
        local_78.refcount = (int *)0x0;
        local_78.elemsize = mins.elemsize;
        local_78.packing = mins.packing;
        local_78.allocator = mins.allocator;
        local_78.dims = 2;
        local_78.w = mins.w;
        local_78.h = mins.h;
        local_78.c = 1;
        local_78.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_78);
        pvVar19 = top_blob->data;
        for (uVar7 = 0; uVar16 != uVar7; uVar7 = uVar7 + 1) {
          *(float *)((long)pvVar19 + uVar7 * 4) =
               *(float *)((long)pvVar15 + uVar7 * 4 + sVar5 * sVar4 * uVar9) +
               *(float *)((long)pvVar19 + uVar7 * 4);
        }
      }
      pvVar15 = top_blob->data;
      for (uVar11 = 0; uVar16 != uVar11; uVar11 = uVar11 + 1) {
        *(float *)((long)pvVar15 + uVar11 * 4) = *(float *)((long)pvVar15 + uVar11 * 4) * local_d4;
      }
      goto LAB_0012f57b;
    }
    goto switchD_0012f3ee_default;
  case 3:
    iVar6 = reduction_op<std::plus<float>,std::plus<float>>
                      (bottom_blob,top_blob,this->coeff,this->dim,in_XMM1_Da,opt);
    if (iVar6 != 0) {
      return -100;
    }
    if (this->dim + 2U < 5) {
      uVar14 = bottom_blob->w;
      uVar2 = bottom_blob->h;
      uVar17 = bottom_blob->c;
      uVar20 = uVar2 * uVar14;
      switch(this->dim) {
      case 0:
        *(float *)top_blob->data = *top_blob->data / (float)(int)(uVar17 * uVar20);
        break;
      case 1:
        pvVar15 = top_blob->data;
        uVar11 = 0;
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        for (; uVar17 != uVar11; uVar11 = uVar11 + 1) {
          *(float *)((long)pvVar15 + uVar11 * 4) =
               *(float *)((long)pvVar15 + uVar11 * 4) * (1.0 / (float)(int)uVar20);
        }
        break;
      case 2:
        uVar20 = 0;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        for (; uVar20 != uVar17; uVar20 = uVar20 + 1) {
          Mat::channel(&mins,top_blob,uVar20);
          pvVar15 = mins.data;
          Mat::~Mat(&mins);
          for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
            *(float *)((long)pvVar15 + uVar11 * 4) =
                 *(float *)((long)pvVar15 + uVar11 * 4) * (1.0 / (float)(int)uVar14);
          }
        }
        break;
      case -2:
        pvVar15 = top_blob->data;
        uVar9 = 0;
        uVar11 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar11 = uVar9;
        }
        for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          *(float *)((long)pvVar15 + uVar9 * 4) =
               *(float *)((long)pvVar15 + uVar9 * 4) * (1.0 / (float)(int)uVar17);
        }
        break;
      case -1:
        pvVar15 = top_blob->data;
        uVar9 = 0;
        uVar11 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar11 = uVar9;
        }
        for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          *(float *)((long)pvVar15 + uVar9 * 4) =
               *(float *)((long)pvVar15 + uVar9 * 4) * (1.0 / (float)(int)(uVar17 * uVar2));
        }
      }
    }
    iVar6 = this->operation;
  }
  if (iVar6 != 6) {
    if (iVar6 != 5) {
      if (iVar6 != 4) goto switchD_0012f3ee_default;
      iVar6 = this->dim;
      local_d4 = this->coeff;
      uVar14 = bottom_blob->w;
      uVar2 = bottom_blob->h;
      uVar17 = bottom_blob->c;
      uVar11 = (ulong)uVar17;
      sVar4 = bottom_blob->elemsize;
      if (iVar6 == 0) {
        pAVar8 = opt->blob_allocator;
        uVar20 = 1;
        goto LAB_0012f1d7;
      }
      switch(iVar6) {
      default:
        goto switchD_0012e80a_caseD_0;
      case 1:
        pAVar8 = opt->blob_allocator;
        uVar20 = uVar17;
LAB_0012f1d7:
        Mat::create(top_blob,uVar20,sVar4,pAVar8);
        goto switchD_0012e80a_caseD_0;
      case 2:
        pAVar8 = opt->blob_allocator;
        uVar20 = uVar2;
        uVar12 = uVar17;
        break;
      case -2:
        pAVar8 = opt->blob_allocator;
        uVar20 = uVar14;
        uVar12 = uVar2;
        break;
      case -1:
        pAVar8 = opt->blob_allocator;
        uVar20 = uVar14;
        goto LAB_0012f1d7;
      }
      Mat::create(top_blob,uVar20,uVar12,sVar4,pAVar8);
switchD_0012e80a_caseD_0:
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      uVar20 = uVar2 * uVar14;
      if (iVar6 == 0) {
        Mat::Mat(&mins,uVar17,sVar4,opt->workspace_allocator);
        if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_0012fecd;
        uVar16 = 0;
        uVar9 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar9 = uVar16;
        }
        if ((int)uVar17 < 1) {
          uVar11 = uVar16;
        }
        for (; uVar16 != uVar11; uVar16 = uVar16 + 1) {
          Mat::channel(&local_78,bottom_blob,(int)uVar16);
          pvVar15 = local_78.data;
          Mat::~Mat(&local_78);
          fVar21 = -3.4028235e+38;
          for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
            fVar1 = *(float *)((long)pvVar15 + uVar7 * 4);
            if (fVar21 <= fVar1) {
              fVar21 = fVar1;
            }
          }
          *(float *)((long)mins.data + uVar16 * 4) = fVar21;
        }
        fVar21 = -3.4028235e+38;
        for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          fVar1 = *(float *)((long)mins.data + uVar9 * 4);
          if (fVar21 <= fVar1) {
            fVar21 = fVar1;
          }
        }
        goto LAB_0012f569;
      }
      switch(iVar6) {
      case 0:
        goto switchD_0012f3ee_caseD_0;
      case 1:
        uVar9 = (ulong)uVar20;
        if ((int)uVar20 < 1) {
          uVar9 = 0;
        }
        if ((int)uVar17 < 1) {
          uVar11 = 0;
        }
        for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
          Mat::channel(&mins,bottom_blob,(int)uVar16);
          pvVar15 = mins.data;
          Mat::~Mat(&mins);
          fVar21 = -3.4028235e+38;
          for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
            fVar1 = *(float *)((long)pvVar15 + uVar7 * 4);
            if (fVar21 <= fVar1) {
              fVar21 = fVar1;
            }
          }
          *(float *)((long)top_blob->data + uVar16 * 4) = fVar21 * local_d4;
        }
        break;
      case 2:
        uVar9 = 0;
        if (0 < (int)uVar14) {
          uVar9 = (ulong)uVar14;
        }
        uVar16 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar16 = 0;
        }
        if ((int)uVar17 < 1) {
          uVar11 = 0;
        }
        for (iVar6 = 0; local_c8 = (int)uVar11, iVar6 != local_c8; iVar6 = iVar6 + 1) {
          Mat::channel(&mins,bottom_blob,iVar6);
          pvVar19 = mins.data;
          Mat::~Mat(&mins);
          iVar3 = top_blob->w;
          sVar4 = top_blob->elemsize;
          pvVar15 = top_blob->data;
          for (uVar7 = 0; uVar7 != uVar16; uVar7 = uVar7 + 1) {
            fVar21 = -3.4028235e+38;
            for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
              fVar1 = *(float *)((long)pvVar19 + uVar13 * 4);
              if (fVar21 <= fVar1) {
                fVar21 = fVar1;
              }
            }
            *(float *)((long)pvVar15 + uVar7 * 4 + (long)iVar6 * (long)iVar3 * sVar4) =
                 fVar21 * local_d4;
            pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar14 * 4);
          }
        }
        break;
      case -2:
        Mat::fill(top_blob,-3.4028235e+38);
        uVar14 = 0;
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
          Mat::channel(&mins,bottom_blob,uVar14);
          pvVar19 = mins.data;
          Mat::~Mat(&mins);
          pvVar15 = top_blob->data;
          for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
            fVar21 = *(float *)((long)pvVar19 + uVar11 * 4);
            fVar1 = *(float *)((long)pvVar15 + uVar11 * 4);
            if (fVar21 <= fVar1) {
              fVar21 = fVar1;
            }
            *(float *)((long)pvVar15 + uVar11 * 4) = fVar21;
          }
        }
        pvVar15 = top_blob->data;
        for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
          *(float *)((long)pvVar15 + uVar11 * 4) = *(float *)((long)pvVar15 + uVar11 * 4) * local_d4
          ;
        }
        break;
      case -1:
        Mat::Mat(&mins,uVar14,1,uVar17,sVar4,opt->workspace_allocator);
        if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_0012fecd;
        Mat::fill(&mins,-3.4028235e+38);
        uVar9 = 0;
        uVar16 = 0;
        if (0 < (int)uVar14) {
          uVar16 = (ulong)uVar14;
        }
        uVar7 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar7 = uVar9;
        }
        if ((int)uVar17 < 1) {
          uVar11 = uVar9;
        }
        for (; uVar9 != uVar11; uVar9 = uVar9 + 1) {
          Mat::channel(&local_78,bottom_blob,(int)uVar9);
          pvVar15 = local_78.data;
          Mat::~Mat(&local_78);
          sVar5 = mins.cstep;
          sVar4 = mins.elemsize;
          local_38 = mins.data;
          local_78.data = (void *)(mins.cstep * uVar9 * mins.elemsize + (long)mins.data);
          local_78.refcount = (int *)0x0;
          local_78.elemsize = mins.elemsize;
          local_78.packing = mins.packing;
          local_78.allocator = mins.allocator;
          local_78.dims = 2;
          local_78.w = mins.w;
          local_78.h = mins.h;
          local_78.c = 1;
          local_78.cstep = (size_t)(mins.h * mins.w);
          Mat::~Mat(&local_78);
          lVar18 = sVar5 * sVar4 * uVar9;
          for (uVar13 = 0; uVar13 != uVar7; uVar13 = uVar13 + 1) {
            for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
              fVar21 = *(float *)((long)pvVar15 + uVar13 * 4);
              fVar1 = *(float *)((long)local_38 + uVar10 * 4 + lVar18);
              if (fVar21 <= fVar1) {
                fVar21 = fVar1;
              }
              *(float *)((long)local_38 + uVar10 * 4 + lVar18) = fVar21;
            }
            pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar14 * 4);
          }
        }
        Mat::fill(top_blob,-3.4028235e+38);
        for (uVar9 = 0; sVar5 = mins.cstep, sVar4 = mins.elemsize, pvVar15 = mins.data,
            uVar9 != uVar11; uVar9 = uVar9 + 1) {
          local_78.data = (void *)(mins.cstep * uVar9 * mins.elemsize + (long)mins.data);
          local_78.refcount = (int *)0x0;
          local_78.elemsize = mins.elemsize;
          local_78.packing = mins.packing;
          local_78.allocator = mins.allocator;
          local_78.dims = 2;
          local_78.w = mins.w;
          local_78.h = mins.h;
          local_78.c = 1;
          local_78.cstep = (size_t)(mins.h * mins.w);
          Mat::~Mat(&local_78);
          pvVar19 = top_blob->data;
          for (uVar7 = 0; uVar16 != uVar7; uVar7 = uVar7 + 1) {
            fVar21 = *(float *)((long)pvVar15 + uVar7 * 4 + sVar5 * sVar4 * uVar9);
            fVar1 = *(float *)((long)pvVar19 + uVar7 * 4);
            if (fVar21 <= fVar1) {
              fVar21 = fVar1;
            }
            *(float *)((long)pvVar19 + uVar7 * 4) = fVar21;
          }
        }
        pvVar15 = top_blob->data;
        for (uVar11 = 0; uVar16 != uVar11; uVar11 = uVar11 + 1) {
          *(float *)((long)pvVar15 + uVar11 * 4) = *(float *)((long)pvVar15 + uVar11 * 4) * local_d4
          ;
        }
        goto LAB_0012f57b;
      }
      goto switchD_0012f3ee_default;
    }
    iVar6 = this->dim;
    local_d4 = this->coeff;
    uVar14 = bottom_blob->w;
    uVar2 = bottom_blob->h;
    uVar17 = bottom_blob->c;
    uVar11 = (ulong)uVar17;
    sVar4 = bottom_blob->elemsize;
    if (iVar6 == 0) {
      pAVar8 = opt->blob_allocator;
      uVar20 = 1;
      goto LAB_0012f008;
    }
    switch(iVar6) {
    default:
      goto switchD_0012e87e_caseD_0;
    case 1:
      pAVar8 = opt->blob_allocator;
      uVar20 = uVar17;
LAB_0012f008:
      Mat::create(top_blob,uVar20,sVar4,pAVar8);
      goto switchD_0012e87e_caseD_0;
    case 2:
      pAVar8 = opt->blob_allocator;
      uVar20 = uVar2;
      uVar12 = uVar17;
      break;
    case -2:
      pAVar8 = opt->blob_allocator;
      uVar20 = uVar14;
      uVar12 = uVar2;
      break;
    case -1:
      pAVar8 = opt->blob_allocator;
      uVar20 = uVar14;
      goto LAB_0012f008;
    }
    Mat::create(top_blob,uVar20,uVar12,sVar4,pAVar8);
switchD_0012e87e_caseD_0:
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar20 = uVar2 * uVar14;
    if (iVar6 == 0) {
      Mat::Mat(&mins,uVar17,sVar4,opt->workspace_allocator);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_0012fecd;
      uVar16 = 0;
      uVar9 = (ulong)uVar20;
      if ((int)uVar20 < 1) {
        uVar9 = uVar16;
      }
      if ((int)uVar17 < 1) {
        uVar11 = uVar16;
      }
      for (; uVar16 != uVar11; uVar16 = uVar16 + 1) {
        Mat::channel(&local_78,bottom_blob,(int)uVar16);
        pvVar15 = local_78.data;
        Mat::~Mat(&local_78);
        fVar21 = 3.4028235e+38;
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          fVar1 = *(float *)((long)pvVar15 + uVar7 * 4);
          if (fVar1 <= fVar21) {
            fVar21 = fVar1;
          }
        }
        *(float *)((long)mins.data + uVar16 * 4) = fVar21;
      }
      fVar21 = 3.4028235e+38;
      for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        fVar1 = *(float *)((long)mins.data + uVar9 * 4);
        if (fVar1 <= fVar21) {
          fVar21 = fVar1;
        }
      }
      goto LAB_0012f569;
    }
    switch(iVar6) {
    case 0:
      goto switchD_0012f3ee_caseD_0;
    case 1:
      uVar9 = (ulong)uVar20;
      if ((int)uVar20 < 1) {
        uVar9 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar11 = 0;
      }
      for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
        Mat::channel(&mins,bottom_blob,(int)uVar16);
        pvVar15 = mins.data;
        Mat::~Mat(&mins);
        fVar21 = 3.4028235e+38;
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          fVar1 = *(float *)((long)pvVar15 + uVar7 * 4);
          if (fVar1 <= fVar21) {
            fVar21 = fVar1;
          }
        }
        *(float *)((long)top_blob->data + uVar16 * 4) = fVar21 * local_d4;
      }
      break;
    case 2:
      uVar9 = 0;
      if (0 < (int)uVar14) {
        uVar9 = (ulong)uVar14;
      }
      uVar16 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar16 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar11 = 0;
      }
      for (iVar6 = 0; local_c8 = (int)uVar11, iVar6 != local_c8; iVar6 = iVar6 + 1) {
        Mat::channel(&mins,bottom_blob,iVar6);
        pvVar19 = mins.data;
        Mat::~Mat(&mins);
        iVar3 = top_blob->w;
        sVar4 = top_blob->elemsize;
        pvVar15 = top_blob->data;
        for (uVar7 = 0; uVar7 != uVar16; uVar7 = uVar7 + 1) {
          fVar21 = 3.4028235e+38;
          for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
            fVar1 = *(float *)((long)pvVar19 + uVar13 * 4);
            if (fVar1 <= fVar21) {
              fVar21 = fVar1;
            }
          }
          *(float *)((long)pvVar15 + uVar7 * 4 + (long)iVar6 * (long)iVar3 * sVar4) =
               fVar21 * local_d4;
          pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar14 * 4);
        }
      }
      break;
    case -2:
      Mat::fill(top_blob,3.4028235e+38);
      uVar14 = 0;
      if ((int)uVar20 < 1) {
        uVar20 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar17 = 0;
      }
      for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
        Mat::channel(&mins,bottom_blob,uVar14);
        pvVar19 = mins.data;
        Mat::~Mat(&mins);
        pvVar15 = top_blob->data;
        for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
          fVar21 = *(float *)((long)pvVar19 + uVar11 * 4);
          fVar1 = *(float *)((long)pvVar15 + uVar11 * 4);
          if (fVar1 <= fVar21) {
            fVar21 = fVar1;
          }
          *(float *)((long)pvVar15 + uVar11 * 4) = fVar21;
        }
      }
      pvVar15 = top_blob->data;
      for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
        *(float *)((long)pvVar15 + uVar11 * 4) = *(float *)((long)pvVar15 + uVar11 * 4) * local_d4;
      }
      break;
    case -1:
      Mat::Mat(&mins,uVar14,1,uVar17,sVar4,opt->workspace_allocator);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_0012fecd;
      Mat::fill(&mins,3.4028235e+38);
      uVar9 = 0;
      uVar16 = 0;
      if (0 < (int)uVar14) {
        uVar16 = (ulong)uVar14;
      }
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar9;
      }
      if ((int)uVar17 < 1) {
        uVar11 = uVar9;
      }
      for (; uVar9 != uVar11; uVar9 = uVar9 + 1) {
        Mat::channel(&local_78,bottom_blob,(int)uVar9);
        pvVar15 = local_78.data;
        Mat::~Mat(&local_78);
        sVar5 = mins.cstep;
        sVar4 = mins.elemsize;
        local_38 = mins.data;
        local_78.data = (void *)(mins.cstep * uVar9 * mins.elemsize + (long)mins.data);
        local_78.refcount = (int *)0x0;
        local_78.elemsize = mins.elemsize;
        local_78.packing = mins.packing;
        local_78.allocator = mins.allocator;
        local_78.dims = 2;
        local_78.w = mins.w;
        local_78.h = mins.h;
        local_78.c = 1;
        local_78.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_78);
        lVar18 = sVar5 * sVar4 * uVar9;
        for (uVar13 = 0; uVar13 != uVar7; uVar13 = uVar13 + 1) {
          for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
            fVar21 = *(float *)((long)pvVar15 + uVar13 * 4);
            fVar1 = *(float *)((long)local_38 + uVar10 * 4 + lVar18);
            if (fVar1 <= fVar21) {
              fVar21 = fVar1;
            }
            *(float *)((long)local_38 + uVar10 * 4 + lVar18) = fVar21;
          }
          pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar14 * 4);
        }
      }
      Mat::fill(top_blob,3.4028235e+38);
      for (uVar9 = 0; sVar5 = mins.cstep, sVar4 = mins.elemsize, pvVar15 = mins.data,
          uVar9 != uVar11; uVar9 = uVar9 + 1) {
        local_78.data = (void *)(mins.cstep * uVar9 * mins.elemsize + (long)mins.data);
        local_78.refcount = (int *)0x0;
        local_78.elemsize = mins.elemsize;
        local_78.packing = mins.packing;
        local_78.allocator = mins.allocator;
        local_78.dims = 2;
        local_78.w = mins.w;
        local_78.h = mins.h;
        local_78.c = 1;
        local_78.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_78);
        pvVar19 = top_blob->data;
        for (uVar7 = 0; uVar16 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = *(float *)((long)pvVar15 + uVar7 * 4 + sVar5 * sVar4 * uVar9);
          fVar1 = *(float *)((long)pvVar19 + uVar7 * 4);
          if (fVar1 <= fVar21) {
            fVar21 = fVar1;
          }
          *(float *)((long)pvVar19 + uVar7 * 4) = fVar21;
        }
      }
      pvVar15 = top_blob->data;
      for (uVar11 = 0; uVar16 != uVar11; uVar11 = uVar11 + 1) {
        *(float *)((long)pvVar15 + uVar11 * 4) = *(float *)((long)pvVar15 + uVar11 * 4) * local_d4;
      }
      goto LAB_0012f57b;
    }
    goto switchD_0012f3ee_default;
  }
  iVar6 = this->dim;
  local_d4 = this->coeff;
  uVar14 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  uVar17 = bottom_blob->c;
  uVar11 = (ulong)uVar17;
  sVar4 = bottom_blob->elemsize;
  if (iVar6 == 0) {
    pAVar8 = opt->blob_allocator;
    uVar20 = 1;
    goto LAB_0012f023;
  }
  switch(iVar6) {
  default:
    goto switchD_0012e8ee_caseD_0;
  case 1:
    pAVar8 = opt->blob_allocator;
    uVar20 = uVar17;
LAB_0012f023:
    Mat::create(top_blob,uVar20,sVar4,pAVar8);
    goto switchD_0012e8ee_caseD_0;
  case 2:
    pAVar8 = opt->blob_allocator;
    uVar20 = uVar2;
    uVar12 = uVar17;
    break;
  case -2:
    pAVar8 = opt->blob_allocator;
    uVar20 = uVar14;
    uVar12 = uVar2;
    break;
  case -1:
    pAVar8 = opt->blob_allocator;
    uVar20 = uVar14;
    goto LAB_0012f023;
  }
  Mat::create(top_blob,uVar20,uVar12,sVar4,pAVar8);
switchD_0012e8ee_caseD_0:
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
    return -100;
  }
  uVar20 = uVar2 * uVar14;
  if (iVar6 == 0) {
    Mat::Mat(&mins,uVar17,sVar4,opt->workspace_allocator);
    if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) {
LAB_0012fecd:
      Mat::~Mat(&mins);
      return -100;
    }
    uVar16 = 0;
    uVar9 = (ulong)uVar20;
    if ((int)uVar20 < 1) {
      uVar9 = uVar16;
    }
    if ((int)uVar17 < 1) {
      uVar11 = uVar16;
    }
    for (; uVar16 != uVar11; uVar16 = uVar16 + 1) {
      Mat::channel(&local_78,bottom_blob,(int)uVar16);
      pvVar15 = local_78.data;
      Mat::~Mat(&local_78);
      fVar21 = 1.0;
      for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
        fVar21 = fVar21 * *(float *)((long)pvVar15 + uVar7 * 4);
      }
      *(float *)((long)mins.data + uVar16 * 4) = fVar21;
    }
    fVar21 = 1.0;
    for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      fVar21 = fVar21 * *(float *)((long)mins.data + uVar9 * 4);
    }
LAB_0012f569:
    *(float *)top_blob->data = fVar21 * local_d4;
LAB_0012f57b:
    Mat::~Mat(&mins);
  }
  else {
    switch(iVar6) {
    case 0:
      goto switchD_0012f3ee_caseD_0;
    case 1:
      uVar9 = (ulong)uVar20;
      if ((int)uVar20 < 1) {
        uVar9 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar11 = 0;
      }
      for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
        Mat::channel(&mins,bottom_blob,(int)uVar16);
        pvVar15 = mins.data;
        Mat::~Mat(&mins);
        fVar21 = 1.0;
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          fVar21 = fVar21 * *(float *)((long)pvVar15 + uVar7 * 4);
        }
        *(float *)((long)top_blob->data + uVar16 * 4) = fVar21 * local_d4;
      }
      break;
    case 2:
      uVar9 = 0;
      if (0 < (int)uVar14) {
        uVar9 = (ulong)uVar14;
      }
      uVar16 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar16 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar11 = 0;
      }
      for (iVar6 = 0; local_c8 = (int)uVar11, iVar6 != local_c8; iVar6 = iVar6 + 1) {
        Mat::channel(&mins,bottom_blob,iVar6);
        pvVar19 = mins.data;
        Mat::~Mat(&mins);
        iVar3 = top_blob->w;
        sVar4 = top_blob->elemsize;
        pvVar15 = top_blob->data;
        for (uVar7 = 0; uVar7 != uVar16; uVar7 = uVar7 + 1) {
          fVar21 = 1.0;
          for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
            fVar21 = fVar21 * *(float *)((long)pvVar19 + uVar13 * 4);
          }
          *(float *)((long)pvVar15 + uVar7 * 4 + (long)iVar6 * (long)iVar3 * sVar4) =
               fVar21 * local_d4;
          pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar14 * 4);
        }
      }
      break;
    case -2:
      Mat::fill(top_blob,1.0);
      uVar14 = 0;
      if ((int)uVar20 < 1) {
        uVar20 = 0;
      }
      if ((int)uVar17 < 1) {
        uVar17 = 0;
      }
      for (; uVar14 != uVar17; uVar14 = uVar14 + 1) {
        Mat::channel(&mins,bottom_blob,uVar14);
        pvVar19 = mins.data;
        Mat::~Mat(&mins);
        pvVar15 = top_blob->data;
        for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
          *(float *)((long)pvVar15 + uVar11 * 4) =
               *(float *)((long)pvVar19 + uVar11 * 4) * *(float *)((long)pvVar15 + uVar11 * 4);
        }
      }
      pvVar15 = top_blob->data;
      for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
        *(float *)((long)pvVar15 + uVar11 * 4) = *(float *)((long)pvVar15 + uVar11 * 4) * local_d4;
      }
      break;
    case -1:
      Mat::Mat(&mins,uVar14,1,uVar17,sVar4,opt->workspace_allocator);
      if ((mins.data == (void *)0x0) || ((long)mins.c * mins.cstep == 0)) goto LAB_0012fecd;
      Mat::fill(&mins,1.0);
      uVar9 = 0;
      uVar16 = 0;
      if (0 < (int)uVar14) {
        uVar16 = (ulong)uVar14;
      }
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar9;
      }
      if ((int)uVar17 < 1) {
        uVar11 = uVar9;
      }
      for (; uVar9 != uVar11; uVar9 = uVar9 + 1) {
        Mat::channel(&local_78,bottom_blob,(int)uVar9);
        pvVar15 = local_78.data;
        Mat::~Mat(&local_78);
        sVar5 = mins.cstep;
        sVar4 = mins.elemsize;
        local_38 = mins.data;
        local_78.data = (void *)(mins.cstep * uVar9 * mins.elemsize + (long)mins.data);
        local_78.refcount = (int *)0x0;
        local_78.elemsize = mins.elemsize;
        local_78.packing = mins.packing;
        local_78.allocator = mins.allocator;
        local_78.dims = 2;
        local_78.w = mins.w;
        local_78.h = mins.h;
        local_78.c = 1;
        local_78.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_78);
        lVar18 = sVar5 * sVar4 * uVar9;
        for (uVar13 = 0; uVar13 != uVar7; uVar13 = uVar13 + 1) {
          for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)local_38 + uVar10 * 4 + lVar18) =
                 *(float *)((long)pvVar15 + uVar13 * 4) *
                 *(float *)((long)local_38 + uVar10 * 4 + lVar18);
          }
          pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar14 * 4);
        }
      }
      Mat::fill(top_blob,1.0);
      for (uVar9 = 0; sVar5 = mins.cstep, sVar4 = mins.elemsize, pvVar15 = mins.data,
          uVar9 != uVar11; uVar9 = uVar9 + 1) {
        local_78.data = (void *)(mins.cstep * uVar9 * mins.elemsize + (long)mins.data);
        local_78.refcount = (int *)0x0;
        local_78.elemsize = mins.elemsize;
        local_78.packing = mins.packing;
        local_78.allocator = mins.allocator;
        local_78.dims = 2;
        local_78.w = mins.w;
        local_78.h = mins.h;
        local_78.c = 1;
        local_78.cstep = (size_t)(mins.h * mins.w);
        Mat::~Mat(&local_78);
        pvVar19 = top_blob->data;
        for (uVar7 = 0; uVar16 != uVar7; uVar7 = uVar7 + 1) {
          *(float *)((long)pvVar19 + uVar7 * 4) =
               *(float *)((long)pvVar15 + uVar7 * 4 + sVar5 * sVar4 * uVar9) *
               *(float *)((long)pvVar19 + uVar7 * 4);
        }
      }
      pvVar15 = top_blob->data;
      for (uVar11 = 0; uVar16 != uVar11; uVar11 = uVar11 + 1) {
        *(float *)((long)pvVar15 + uVar11 * 4) = *(float *)((long)pvVar15 + uVar11 * 4) * local_d4;
      }
      goto LAB_0012f57b;
    }
  }
switchD_0012f3ee_default:
switchD_0012f3ee_caseD_0:
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (operation == ReductionOp_SUM)
        return reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);

    if (operation == ReductionOp_ASUM)
        return reduction_op< reduction_op_asum<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction_op< reduction_op_sumsq<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);

    if (operation == ReductionOp_MEAN)
    {
        int ret = reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);
        if (ret != 0)
            return -100;

        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        if (dim == 0)
        {
            top_blob[0] /= channels * size;
        }
        else if (dim == 1)
        {
            for (int q=0; q<channels; q++)
            {
                top_blob[q] /= size;
            }
        }
        else if (dim == 2)
        {
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<h; i++)
                {
                    outptr[i] /= w;
                }
            }
        }
        else if (dim == -1)
        {
            for (int j=0; j<w; j++)
            {
                top_blob[j] /= h * channels;
            }
        }
        else if (dim == -2)
        {
            for (int i=0; i<size; i++)
            {
                top_blob[i] /= channels;
            }
        }
    }

    if (operation == ReductionOp_MAX)
        return reduction_op< reduction_op_max<float>, reduction_op_max<float> >(bottom_blob, top_blob, -FLT_MAX, dim, coeff, opt);

    if (operation == ReductionOp_MIN)
        return reduction_op< reduction_op_min<float>, reduction_op_min<float> >(bottom_blob, top_blob, FLT_MAX, dim, coeff, opt);

    if (operation == ReductionOp_PROD)
        return reduction_op< std::multiplies<float>, std::multiplies<float> >(bottom_blob, top_blob, 1.f, dim, coeff, opt);

    return 0;
}